

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.h
# Opt level: O2

bool __thiscall Assimp::MD5::MD5Parser::SkipSpacesAndLineEnd(MD5Parser *this,char *in,char **out)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = this->lineNumber;
  bVar4 = false;
  do {
    cVar1 = *in;
    bVar2 = false;
    if (cVar1 != '\t') {
      if (cVar1 != '\n') {
        bVar2 = false;
        if (cVar1 == ' ') goto LAB_004354c7;
        if (cVar1 != '\r') {
          *out = in;
          return *in != '\0';
        }
      }
      bVar2 = true;
      if (!bVar4) {
        uVar3 = uVar3 + 1;
        this->lineNumber = uVar3;
      }
    }
LAB_004354c7:
    bVar4 = bVar2;
    in = in + 1;
  } while( true );
}

Assistant:

bool SkipSpacesAndLineEnd( const char* in, const char** out)
    {
        bool bHad = false;
        bool running = true;
        while (running) {
            if( *in == '\r' || *in == '\n') {
                 // we open files in binary mode, so there could be \r\n sequences ...
                if (!bHad)  {
                    bHad = true;
                    ++lineNumber;
                }
            }
            else if (*in == '\t' || *in == ' ')bHad = false;
            else break;
            in++;
        }
        *out = in;
        return *in != '\0';
    }